

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImGuiTextBuffer::clear(ImGuiTextBuffer *this)

{
  ImGuiTextBuffer *this_local;
  
  ImVector<char>::clear(&this->Buf);
  return;
}

Assistant:

void                clear()                 { Buf.clear(); }